

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

int __thiscall
testing::internal::UnitTestImpl::FilterTests(UnitTestImpl *this,ReactionToSharding shard_tests)

{
  TestSuite *pTVar1;
  TestInfo *pTVar2;
  bool bVar3;
  bool bVar4;
  pointer ppTVar5;
  byte bVar6;
  pointer ppTVar7;
  ulong uVar8;
  undefined4 in_register_00000034;
  string *filter;
  int iVar9;
  bool bVar10;
  string test_name;
  UnitTestFilter disable_test_filter;
  PositiveAndNegativeUnitTestFilter gtest_flag_filter;
  allocator<char> local_189;
  int32_t local_188;
  int32_t local_184;
  undefined1 local_180 [32];
  ulong local_160;
  ReactionToSharding local_158;
  int local_154;
  string local_150;
  pointer local_130;
  pointer local_128;
  UnitTestFilter local_120;
  PositiveAndNegativeUnitTestFilter local_d0;
  
  filter = (string *)CONCAT44(in_register_00000034,shard_tests);
  local_184 = -1;
  local_188 = -1;
  local_158 = shard_tests;
  if (shard_tests == HONOR_SHARDING_PROTOCOL) {
    local_184 = Int32FromEnvOrDie("GTEST_TOTAL_SHARDS",-1);
    filter = (string *)0xffffffff;
    local_188 = Int32FromEnvOrDie("GTEST_SHARD_INDEX",-1);
  }
  anon_unknown_37::PositiveAndNegativeUnitTestFilter::PositiveAndNegativeUnitTestFilter
            (&local_d0,filter);
  local_180._0_8_ = local_180 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_180,"DISABLED_*:*/DISABLED_*","");
  anon_unknown_37::UnitTestFilter::UnitTestFilter(&local_120,(string *)local_180);
  if ((string *)local_180._0_8_ != (string *)(local_180 + 0x10)) {
    operator_delete((void *)local_180._0_8_,local_180._16_8_ + 1);
  }
  ppTVar7 = (this->test_suites_).
            super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  local_130 = (this->test_suites_).
              super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
  if (ppTVar7 == local_130) {
    iVar9 = 0;
  }
  else {
    local_160 = 0;
    iVar9 = 0;
    do {
      pTVar1 = *ppTVar7;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_180,(pTVar1->name_)._M_dataplus._M_p,(allocator<char> *)&local_150)
      ;
      pTVar1->should_run_ = false;
      ppTVar5 = (pTVar1->test_info_list_).
                super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      local_128 = ppTVar7;
      if ((pTVar1->test_info_list_).
          super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>._M_impl.
          super__Vector_impl_data._M_finish != ppTVar5) {
        uVar8 = 0;
        do {
          pTVar2 = ppTVar5[uVar8];
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_150,(pTVar2->name_)._M_dataplus._M_p,&local_189);
          bVar3 = anon_unknown_37::UnitTestFilter::MatchesName(&local_120,(string *)local_180);
          bVar4 = true;
          if (!bVar3) {
            bVar4 = anon_unknown_37::UnitTestFilter::MatchesName(&local_120,&local_150);
          }
          pTVar2->is_disabled_ = bVar4;
          bVar3 = anon_unknown_37::PositiveAndNegativeUnitTestFilter::MatchesTest
                            (&local_d0,(string *)local_180._0_8_,(string *)local_180._8_8_);
          pTVar2->matches_filter_ = bVar3;
          if (local_158 == IGNORE_SHARDING_PROTOCOL) {
            bVar10 = false;
          }
          else {
            bVar10 = (int)((long)((ulong)(uint)((int)local_160 >> 0x1f) << 0x20 |
                                 local_160 & 0xffffffff) % (long)local_184) != local_188;
          }
          bVar6 = bVar3 & (bVar4 ^ 1U | FLAGS_gtest_also_run_disabled_tests);
          pTVar2->is_in_another_shard_ = bVar10;
          bVar3 = (bool)((bVar10 ^ 1U) & bVar6);
          pTVar2->should_run_ = bVar3;
          pTVar1->should_run_ = (bool)(pTVar1->should_run_ | bVar3);
          local_154 = iVar9;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_150._M_dataplus._M_p != &local_150.field_2) {
            operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
          }
          local_160 = (ulong)((int)local_160 + (uint)bVar6);
          iVar9 = local_154 + (uint)bVar3;
          uVar8 = uVar8 + 1;
          ppTVar5 = (pTVar1->test_info_list_).
                    super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>.
                    _M_impl.super__Vector_impl_data._M_start;
        } while (uVar8 < (ulong)((long)(pTVar1->test_info_list_).
                                       super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar5 >>
                                3));
      }
      if ((string *)local_180._0_8_ != (string *)(local_180 + 0x10)) {
        operator_delete((void *)local_180._0_8_,local_180._16_8_ + 1);
      }
      ppTVar7 = local_128 + 1;
    } while (ppTVar7 != local_130);
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&local_120.exact_match_patterns_._M_h);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_120.glob_patterns_);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&local_d0.negative_filter_.exact_match_patterns_._M_h);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_d0.negative_filter_.glob_patterns_);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&local_d0.positive_filter_.exact_match_patterns_._M_h);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_d0);
  return iVar9;
}

Assistant:

int UnitTestImpl::FilterTests(ReactionToSharding shard_tests) {
  const int32_t total_shards = shard_tests == HONOR_SHARDING_PROTOCOL
                                   ? Int32FromEnvOrDie(kTestTotalShards, -1)
                                   : -1;
  const int32_t shard_index = shard_tests == HONOR_SHARDING_PROTOCOL
                                  ? Int32FromEnvOrDie(kTestShardIndex, -1)
                                  : -1;

  const PositiveAndNegativeUnitTestFilter gtest_flag_filter(
      GTEST_FLAG_GET(filter));
  const UnitTestFilter disable_test_filter(kDisableTestFilter);
  // num_runnable_tests are the number of tests that will
  // run across all shards (i.e., match filter and are not disabled).
  // num_selected_tests are the number of tests to be run on
  // this shard.
  int num_runnable_tests = 0;
  int num_selected_tests = 0;
  for (auto* test_suite : test_suites_) {
    const std::string& test_suite_name = test_suite->name();
    test_suite->set_should_run(false);

    for (size_t j = 0; j < test_suite->test_info_list().size(); j++) {
      TestInfo* const test_info = test_suite->test_info_list()[j];
      const std::string test_name(test_info->name());
      // A test is disabled if test suite name or test name matches
      // kDisableTestFilter.
      const bool is_disabled =
          disable_test_filter.MatchesName(test_suite_name) ||
          disable_test_filter.MatchesName(test_name);
      test_info->is_disabled_ = is_disabled;

      const bool matches_filter =
          gtest_flag_filter.MatchesTest(test_suite_name, test_name);
      test_info->matches_filter_ = matches_filter;

      const bool is_runnable =
          (GTEST_FLAG_GET(also_run_disabled_tests) || !is_disabled) &&
          matches_filter;

      const bool is_in_another_shard =
          shard_tests != IGNORE_SHARDING_PROTOCOL &&
          !ShouldRunTestOnShard(total_shards, shard_index, num_runnable_tests);
      test_info->is_in_another_shard_ = is_in_another_shard;
      const bool is_selected = is_runnable && !is_in_another_shard;

      num_runnable_tests += is_runnable;
      num_selected_tests += is_selected;

      test_info->should_run_ = is_selected;
      test_suite->set_should_run(test_suite->should_run() || is_selected);
    }
  }
  return num_selected_tests;
}